

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O3

void __thiscall
Equality_modelNotEqualInvalidInput_Test::TestBody(Equality_modelNotEqualInvalidInput_Test *this)

{
  byte bVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  ModelPtr m1;
  long *local_58;
  AssertHelper local_50 [8];
  byte local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  long *local_38;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_30;
  long local_28 [2];
  shared_ptr *local_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  libcellml::Model::create();
  local_38 = (long *)0x0;
  sStack_30.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  bVar1 = libcellml::Entity::equals(local_18);
  local_48[0] = bVar1 ^ 1;
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (sStack_30.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_30.ptr_);
  }
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_38,(char *)local_48,"m1->equals(nullptr)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x371,(char *)local_38);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
    if (local_58 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_58 != (long *)0x0)) {
        (**(code **)(*local_58 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
  }
  return;
}

Assistant:

TEST(Equality, modelNotEqualInvalidInput)
{
    libcellml::ModelPtr m1 = libcellml::Model::create();

    EXPECT_FALSE(m1->equals(nullptr));
}